

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char *pcVar1;
  size_type __dnew;
  size_type local_18;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_18 = 0x39;
  pcVar1 = (char *)std::__cxx11::string::_M_create((ulong *)__return_storage_ptr__,(ulong)&local_18)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_18;
  builtin_strncpy(pcVar1,"Option must not use reserved name \"uninterpreted_option\".",0x39);
  __return_storage_ptr__->_M_string_length = local_18;
  pcVar1[local_18] = '\0';
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}